

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

char * lua_tolstring(lua_State *L,int idx,size_t *len)

{
  TValue *pTVar1;
  GCstr *local_a0;
  GCstr *s;
  TValue *o;
  size_t *len_local;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,idx);
  if ((int)(pTVar1->field_4).it >> 0xf == -5) {
    local_a0 = (GCstr *)(pTVar1->u64 & 0x7fffffffffff);
  }
  else {
    if (0xfffffff2 < (uint)((int)(pTVar1->field_4).it >> 0xf)) {
      if (len != (size_t *)0x0) {
        *len = 0;
      }
      return (char *)0x0;
    }
    if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
      lj_gc_step(L);
    }
    pTVar1 = index2adr(L,idx);
    local_a0 = lj_strfmt_number(L,pTVar1);
    pTVar1->u64 = (ulong)local_a0 | 0xfffd800000000000;
  }
  if (len != (size_t *)0x0) {
    *len = (ulong)local_a0->len;
  }
  return (char *)(local_a0 + 1);
}

Assistant:

LUA_API const char *lua_tolstring(lua_State *L, int idx, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
  } else {
    if (len != NULL) *len = 0;
    return NULL;
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}